

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::Maybe
          (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *this,
          Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *other)

{
  NullableValue<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *other_00;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *other_local;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *this_local;
  
  other_00 = mv<kj::_::NullableValue<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>>
                       (&other->ptr);
  kj::_::NullableValue<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::
  NullableValue(&this->ptr,other_00);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }